

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O1

void __thiscall Clasp::LoopFormula::reason(LoopFormula *this,Solver *s,Literal p,LitVec *lits)

{
  uint uVar1;
  ulong in_RAX;
  ulong uVar2;
  ScoreType *pSVar3;
  undefined8 uStack_38;
  
  uVar2 = (ulong)(this->other_ == *(uint *)&this->field_0x10 >> 0x1f);
  uVar1 = *(uint *)((long)&this[1].super_Constraint._vptr_Constraint + uVar2 * 4 + 4);
  uStack_38 = in_RAX;
  if (3 < uVar1) {
    pSVar3 = &this[1].act_ + uVar2;
    do {
      if (1 < (uVar1 ^ p.rep_)) {
        uStack_38 = CONCAT44(uVar1,(undefined4)uStack_38) & 0xfffffffeffffffff ^ 0x200000000;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (lits,(Literal *)((long)&uStack_38 + 4));
      }
      uVar1 = pSVar3->rep;
      pSVar3 = pSVar3 + 1;
    } while (3 < uVar1);
  }
  Solver::updateOnReason(s,&this->act_,p,lits);
  return;
}

Assistant:

void LoopFormula::reason(Solver& s, Literal p, LitVec& lits) {
	// p = body: all literals in active clause
	// p = atom: only bodies
	for (Literal* it = begin() + (other_ == xPos_); !isSentinel(*it); ++it) {
		if (*it != p) { lits.push_back(~*it); }
	}
	s.updateOnReason(act_, p, lits);
}